

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * calculate_global_layer_weights(void)

{
  pointer piVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> *in_RDI;
  long lVar8;
  vector<double,_std::allocator<double>_> weights;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  spatial_region::calculate_layer_weights
            (&local_60,
             (spatial_region *)
             psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,balancing_particle_weight);
  iVar6 = mpi_rank;
  lVar8 = (long)mpi_rank;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (lVar8 == 0) {
    std::vector<double,_std::allocator<double>_>::vector(&local_48,(long)nx_global,&local_61);
    piVar1 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    iVar6 = n_sr;
    uVar3 = (ulong)(uint)n_sr;
    uVar4 = *piVar1;
    if (0 < n_sr) {
      uVar4 = uVar4 - nx_ich / 2;
    }
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar7] =
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    if (1 < iVar6) {
      uVar7 = 1;
      do {
        iVar6 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7];
        iVar5 = nx_ich / 2;
        if (uVar7 != (int)uVar3 - 1) {
          iVar6 = iVar6 - iVar5;
        }
        MPI_Recv(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 (long)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7] + (long)iVar5,iVar6 - iVar5,
                 &ompi_mpi_double,uVar7 & 0xffffffff,uVar7 & 0xffffffff,&ompi_mpi_comm_world,0);
        uVar3 = (ulong)n_sr;
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)uVar3);
    }
  }
  else {
    iVar5 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar8];
    iVar2 = nx_ich / 2;
    if (iVar6 != n_sr + -1) {
      iVar5 = iVar5 - iVar2;
    }
    MPI_Send(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + iVar2,iVar5 - iVar2,&ompi_mpi_double,0,lVar8,
             &ompi_mpi_comm_world);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

vector<double> calculate_global_layer_weights() {
    auto weights = psr->calculate_layer_weights(balancing_particle_weight);

    vector<double> global_weights;

    if (mpi_rank == 0) {
        global_weights = vector<double>(nx_global);

        int left = 0;
        int right = ((n_sr > 0) ? nx_sr[0] - nx_ich / 2 : nx_sr[0]);

        for (int i = left; i < right; i++) {
            global_weights[i] = weights[i];
        }

        for (int n = 1; n < n_sr; n++) {
            left = nx_ich / 2;
            right = (n == n_sr-1 ? nx_sr[n] : nx_sr[n] - nx_ich / 2);
            MPI_Recv(&(global_weights[x0_sr[n] + left]), right-left, MPI_DOUBLE, n, n, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
        }
    } else {
        int left = nx_ich / 2;
        int right = (mpi_rank == n_sr-1 ? nx_sr[mpi_rank] : nx_sr[mpi_rank] - nx_ich / 2);
        MPI_Send(&(weights[left]), right - left, MPI_DOUBLE, 0, mpi_rank, MPI_COMM_WORLD);
    }

    return global_weights;
}